

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O2

SQInteger container_findvalue(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  bool bVar2;
  SQInteger SVar3;
  SQRESULT SVar4;
  SQObjectPtr *pSVar5;
  SQInteger idx;
  SQObjectPtr *pSVar6;
  SQObjectPtr local_48;
  SQObject *local_38;
  
  SVar3 = sq_gettop(v);
  if (3 < SVar3) {
    SVar4 = sq_throwerror(v,"Too many arguments for findvalue()");
    return SVar4;
  }
  pSVar5 = stack_get(v,1);
  local_38 = &stack_get(v,2)->super_SQObject;
  SVar3 = get_allowed_args_count(local_38,4);
  sq_pushnull(v);
  while( true ) {
    SVar4 = sq_next(v,1);
    if (SVar4 < 0) {
      sq_pop(v,1);
      SVar3 = sq_gettop(v);
      return (ulong)(2 < SVar3);
    }
    idx = sq_gettop(v);
    local_48.super_SQObject._type = local_38->_type;
    local_48.super_SQObject._flags = local_38->_flags;
    local_48.super_SQObject._5_3_ = *(undefined3 *)&local_38->field_0x5;
    local_48.super_SQObject._unVal = (SQObjectValue)(local_38->_unVal).pTable;
    if ((local_48.super_SQObject._0_8_ & 0x8000000) != 0) {
      pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    SQVM::Push(v,&local_48);
    SQObjectPtr::~SQObjectPtr(&local_48);
    local_48.super_SQObject._type = (pSVar5->super_SQObject)._type;
    local_48.super_SQObject._flags = (pSVar5->super_SQObject)._flags;
    local_48.super_SQObject._5_3_ = *(undefined3 *)&(pSVar5->super_SQObject).field_0x5;
    local_48.super_SQObject._unVal = (SQObjectValue)(pSVar5->super_SQObject)._unVal.pTable;
    if ((local_48.super_SQObject._0_8_ & 0x8000000) != 0) {
      pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    SQVM::Push(v,&local_48);
    SQObjectPtr::~SQObjectPtr(&local_48);
    pSVar6 = stack_get(v,idx);
    SQVM::Push(v,pSVar6);
    if (2 < SVar3) {
      pSVar6 = stack_get(v,idx + -1);
      SQVM::Push(v,pSVar6);
      if (SVar3 != 3) {
        local_48.super_SQObject._type = (pSVar5->super_SQObject)._type;
        local_48.super_SQObject._flags = (pSVar5->super_SQObject)._flags;
        local_48.super_SQObject._5_3_ = *(undefined3 *)&(pSVar5->super_SQObject).field_0x5;
        local_48.super_SQObject._unVal = (SQObjectValue)(pSVar5->super_SQObject)._unVal.pTable;
        if ((local_48.super_SQObject._0_8_ & 0x8000000) != 0) {
          pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable
                    .super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 + 1;
        }
        SQVM::Push(v,&local_48);
        SQObjectPtr::~SQObjectPtr(&local_48);
      }
    }
    SVar4 = sq_call(v,SVar3,1,1);
    if (SVar4 < 0) break;
    pSVar6 = SQVM::GetUp(v,-1);
    bVar2 = SQVM::IsFalse(pSVar6);
    if (!bVar2) {
      pSVar5 = stack_get(v,idx);
      SQVM::Push(v,pSVar5);
      return 1;
    }
    SQVM::Pop(v,4);
  }
  return -1;
}

Assistant:

static SQInteger container_findvalue(HSQUIRRELVM v)
{
    if (sq_gettop(v) > 3)
        return sq_throwerror(v, _SC("Too many arguments for findvalue()"));

    SQObject &o = stack_get(v,1);
    SQObject &closure = stack_get(v, 2);
    SQInteger nArgs = get_allowed_args_count(closure, 4);

    sq_pushnull(v);
    while (SQ_SUCCEEDED(sq_next(v, 1))) {
        SQInteger iterTop = sq_gettop(v);
        v->Push(closure);
        v->Push(o);
        v->Push(stack_get(v, iterTop));
        if (nArgs >= 3)
            v->Push(stack_get(v, iterTop-1));
        if (nArgs >= 4)
            v->Push(o);

        if (SQ_FAILED(sq_call(v,nArgs,SQTrue,SQ_BASELIB_INVOKE_CB_ERR_HANDLER))) {
            return SQ_ERROR;
        }
        if (!v->IsFalse(stack_get(v, -1))) {
            v->Push(stack_get(v, iterTop));
            return 1;
        }
        v->Pop(4);
    }
    sq_pop(v, 1); // pops the iterator

    return sq_gettop(v) > 2 ? 1 : 0;
}